

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::BufferStorage::MapPersistentReadPixelsTest::iterate(MapPersistentReadPixelsTest *this)

{
  int iVar1;
  GLenum GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  GetNameFunc local_478;
  int local_470;
  string local_468;
  char *local_448;
  MessageBuilder local_440;
  GLenum local_2bc;
  undefined1 auStack_2b8 [4];
  GLenum error;
  GLvoid *local_2b0;
  undefined1 local_2a8 [8];
  MapOwner tmp;
  MoveMapOwner local_118;
  undefined1 local_108 [8];
  MapOwner map;
  Texture texture;
  undefined1 local_d8 [8];
  Framebuffer framebuffer;
  Buffer buffer;
  size_t i;
  GLubyte updated_texture_data [64];
  GLubyte initial_texture_data [64];
  bool local_19;
  bool test_result;
  Functions *gl;
  MapPersistentReadPixelsTest *this_local;
  Functions *gl_00;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  buffer.m_target = 0;
  buffer._20_4_ = 0;
  for (; (ulong)buffer._16_8_ < 0x40; buffer._16_8_ = buffer._16_8_ + 1) {
    updated_texture_data[buffer._16_8_ + 0x38] = (GLubyte)buffer.m_target;
    updated_texture_data[buffer._16_8_ + -8] = '@' - (GLubyte)buffer.m_target;
  }
  BufferStorage::Buffer::Buffer((Buffer *)&framebuffer.m_context,(this->super_TestCase).m_context);
  BufferStorage::Framebuffer::Framebuffer((Framebuffer *)local_d8,(this->super_TestCase).m_context);
  BufferStorage::Texture::Texture((Texture *)&map.m_buffer,(this->super_TestCase).m_context);
  BufferStorage::Buffer::InitStorage
            ((Buffer *)&framebuffer.m_context,0x88eb,0x43,0x40,(GLvoid *)0x0);
  BufferStorage::Texture::Generate(gl_00,(GLuint *)&map.m_buffer);
  BufferStorage::Texture::Bind(gl_00,(GLuint)map.m_buffer,0xde1);
  BufferStorage::Texture::Storage(gl_00,0xde1,1,0x8232,8,8,0);
  BufferStorage::Texture::SubImage
            (gl_00,0xde1,0,0,0,0,8,8,0,0x8d94,0x1401,updated_texture_data + 0x38);
  BufferStorage::Framebuffer::Generate(gl_00,(GLuint *)local_d8);
  BufferStorage::Framebuffer::Bind(gl_00,0x8ca8,local_d8._0_4_);
  BufferStorage::Framebuffer::AttachTexture(gl_00,0x8ca8,0x8ce0,(GLuint)map.m_buffer,8,8);
  BufferStorage::Buffer::Bind((Buffer *)&framebuffer.m_context);
  (*gl_00->readPixels)(0,0,8,8,0x8d94,0x1401,(void *)0x0);
  GVar2 = (*gl_00->getError)();
  glu::checkError(GVar2,"ReadPixels to not mapped PIXEL_PACK buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb2b);
  BufferStorage::Texture::SubImage(gl_00,0xde1,0,0,0,0,8,8,0,0x8d94,0x1401,&i);
  local_118 = BufferStorage::Buffer::MapRange((Buffer *)&framebuffer.m_context,0,0x40,0x43);
  BufferStorage::Buffer::MapOwner::MapOwner((MapOwner *)local_108,&local_118);
  BufferStorage::Buffer::Bind((Buffer *)&framebuffer.m_context);
  (*gl_00->readPixels)(0,0,8,8,0x8d94,0x1401,(void *)0x0);
  GVar2 = (*gl_00->getError)();
  glu::checkError(GVar2,"ReadPixels to persistently mapped PIXEL_PACK buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb42);
  (*gl_00->memoryBarrier)(0x4000);
  GVar2 = (*gl_00->getError)();
  glu::checkError(GVar2,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb45);
  (*gl_00->finish)();
  GVar2 = (*gl_00->getError)();
  glu::checkError(GVar2,"Finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xb48);
  iVar1 = memcmp(&i,(void *)local_108,0x40);
  if (iVar1 != 0) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&tmp.m_buffer,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&tmp.m_buffer,
                        (char (*) [73])
                        "Wrong contents of persistently mapped PIXEL_PACK buffer after ReadPixels");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&tmp.m_buffer);
  }
  local_19 = iVar1 == 0;
  BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)local_108);
  _auStack_2b8 = BufferStorage::Buffer::MapRange((Buffer *)&framebuffer.m_context,0,0x40,3);
  BufferStorage::Buffer::MapOwner::MapOwner((MapOwner *)local_2a8,(MoveMapOwner *)auStack_2b8);
  BufferStorage::Buffer::Bind((Buffer *)&framebuffer.m_context);
  (*gl_00->readPixels)(0,0,8,8,0x8d94,0x1401,(void *)0x0);
  local_2bc = (*gl_00->getError)();
  if (local_2bc != 0x502) {
    local_19 = false;
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_440,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_440,
                        (char (*) [106])
                        "Wrong error was generated by ReadPixels. Expected INVALID_OPERATION as PIXEL_PACK buffer is mapped. Got: "
                       );
    EVar7 = glu::getErrorStr(local_2bc);
    local_478 = EVar7.m_getName;
    local_470 = EVar7.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_468,&local_478);
    local_448 = (char *)std::__cxx11::string::c_str();
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_448);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_468);
    tcu::MessageBuilder::~MessageBuilder(&local_440);
  }
  BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)local_2a8);
  if (local_19) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,"Fail");
  }
  BufferStorage::Texture::~Texture((Texture *)&map.m_buffer);
  BufferStorage::Framebuffer::~Framebuffer((Framebuffer *)local_d8);
  BufferStorage::Buffer::~Buffer((Buffer *)&framebuffer.m_context);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapPersistentReadPixelsTest::iterate()
{
	static const GLuint height	= 8;
	static const GLuint width	 = 8;
	static const size_t data_size = width * height;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/* Prepare data */
	GLubyte initial_texture_data[data_size];
	GLubyte updated_texture_data[data_size];

	for (size_t i = 0; i < data_size; ++i)
	{
		initial_texture_data[i] = (glw::GLubyte)i;
		updated_texture_data[i] = (glw::GLubyte)(data_size - i);
	}

	/* Prepare GL objects */
	Buffer		buffer(m_context);
	Framebuffer framebuffer(m_context);
	Texture		texture(m_context);

	buffer.InitStorage(GL_PIXEL_PACK_BUFFER, GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, data_size,
					   0 /* data */);

	Texture::Generate(gl, texture.m_id);
	Texture::Bind(gl, texture.m_id, GL_TEXTURE_2D);
	Texture::Storage(gl, GL_TEXTURE_2D, 1 /* levels */, GL_R8UI, width, height, 0 /* depth */);
	Texture::SubImage(gl, GL_TEXTURE_2D, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, width, height, 0 /* depth */,
					  GL_RED_INTEGER, GL_UNSIGNED_BYTE, initial_texture_data);

	Framebuffer::Generate(gl, framebuffer.m_id);
	Framebuffer::Bind(gl, GL_READ_FRAMEBUFFER, framebuffer.m_id);
	Framebuffer::AttachTexture(gl, GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture.m_id, width, height);

	/*
	 * - execute ReadPixels to transfer texture contents to buffer, no error should
	 * be generated;
	 */
	buffer.Bind();
	gl.readPixels(0 /* x */, 0 /* y */, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE,
				  0 /* offset in PIXEL_PACK_BUFFER */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ReadPixels to not mapped PIXEL_PACK buffer");

	/*
	 * - update contents of texture with different image;
	 * - map buffer contents with MapBufferRange, <access> should contain
	 * MAP_PERSISTENT_BIT, MAP_READ_BIT and MAP_WRITE_BIT;
	 * - execute ReadPixels to transfer texture contents to buffer, no error should
	 * be generated;
	 * - execute MemoryBarrier with CLIENT_MAPPED_BUFFER_BARRIER_BIT and Finish;
	 * - inspect contents of mapped buffer, to verify that latest data transfer was
	 * successful;
	 * - unmap buffer
	 */
	{
		Texture::SubImage(gl, GL_TEXTURE_2D, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, width, height,
						  0 /* depth */, GL_RED_INTEGER, GL_UNSIGNED_BYTE, updated_texture_data);

		const Buffer::MapOwner map(
			buffer.MapRange(0 /* offset */, data_size, GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));

		buffer.Bind();
		gl.readPixels(0 /* x */, 0 /* y */, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE,
					  0 /* offset in PIXEL_PACK_BUFFER */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ReadPixels to persistently mapped PIXEL_PACK buffer");

		gl.memoryBarrier(GL_CLIENT_MAPPED_BUFFER_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Finish");

		if (0 != memcmp(updated_texture_data, map.m_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Wrong contents of persistently mapped PIXEL_PACK buffer after ReadPixels"
				<< tcu::TestLog::EndMessage;
		}
	}

	/*
	 * - map buffer contents again, this time do not provide MAP_PERSISTENT_BIT;
	 * - execute ReadPixels to transfer texture contents to buffer,
	 * INVALID_OPERATION error should be generated.
	 */
	{
		Buffer::MapOwner tmp(buffer.MapRange(0 /* offset */, data_size, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));

		buffer.Bind();
		gl.readPixels(0 /* x */, 0 /* y */, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE,
					  0 /* offset in PIXEL_PACK_BUFFER */);
		GLenum error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Wrong error was generated by ReadPixels. Expected INVALID_OPERATION as "
											"PIXEL_PACK buffer is mapped. Got: "
				<< glu::getErrorStr(error).toString().c_str() << tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}